

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

ssize_t read(int __fd,void *__buf,size_t __nbytes)

{
  size_t __n;
  long in_RCX;
  undefined4 in_register_0000003c;
  uint64_t data_read;
  uint64_t sz;
  trico_archive *arch_local;
  uint64_t element_count_local;
  uint64_t element_size_local;
  void *buf_local;
  
  if (*(int *)(in_RCX + 0x40) == 0) {
    __n = (long)__buf * __nbytes;
    if (*(ulong *)(in_RCX + 0x30) < (*(long *)(in_RCX + 0x18) - *(long *)(in_RCX + 0x10)) + __n) {
      buf_local._4_4_ = 0;
    }
    else {
      memcpy((void *)CONCAT44(in_register_0000003c,__fd),*(void **)(in_RCX + 0x18),__n);
      *(size_t *)(in_RCX + 0x18) = __n + *(long *)(in_RCX + 0x18);
      buf_local._4_4_ = 1;
    }
  }
  else {
    buf_local._4_4_ = 0;
  }
  return (ulong)buf_local._4_4_;
}

Assistant:

static int read(void* buf, uint64_t element_size, uint64_t element_count, struct trico_archive* arch)
  {
  if (arch->writable)
    return 0;
  uint64_t sz = element_size * element_count;
  uint64_t data_read = arch->data_pointer - arch->data;
  if ((data_read + sz) > arch->data_size)
    return 0;
  memcpy(buf, arch->data_pointer, sz);
  arch->data_pointer += sz;
  return 1;
  }